

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O0

void duckdb::FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
               (ColumnWriterStatistics *stats,float target_value)

{
  bool bVar1;
  FloatingPointStatisticsState<duckdb::float_na_equal,_float,_duckdb::BaseParquetOperator> *right;
  float in_XMM0_Da;
  FloatingPointStatisticsState<duckdb::float_na_equal,_float,_duckdb::BaseParquetOperator>
  *numeric_stats;
  undefined4 in_stack_fffffffffffffff0;
  
  right = ColumnWriterStatistics::
          Cast<duckdb::FloatingPointStatisticsState<duckdb::float_na_equal,float,duckdb::BaseParquetOperator>>
                    ((ColumnWriterStatistics *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0));
  bVar1 = Value::IsNan<float>(0.0);
  if (bVar1) {
    right->has_nan = true;
  }
  else {
    bVar1 = LessThan::Operation<float>
                      ((float *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),(float *)right);
    if (bVar1) {
      (right->
      super_NumericStatisticsState<duckdb::float_na_equal,_float,_duckdb::BaseParquetOperator>).min
           = in_XMM0_Da;
    }
    bVar1 = GreaterThan::Operation<float>
                      ((float *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),(float *)right);
    if (bVar1) {
      (right->
      super_NumericStatisticsState<duckdb::float_na_equal,_float,_duckdb::BaseParquetOperator>).max
           = in_XMM0_Da;
    }
  }
  return;
}

Assistant:

static void HandleStats(ColumnWriterStatistics *stats, TGT target_value) {
		auto &numeric_stats = stats->Cast<FloatingPointStatisticsState<SRC, TGT, BaseParquetOperator>>();
		if (Value::IsNan(target_value)) {
			numeric_stats.has_nan = true;
		} else {
			if (LessThan::Operation(target_value, numeric_stats.min)) {
				numeric_stats.min = target_value;
			}
			if (GreaterThan::Operation(target_value, numeric_stats.max)) {
				numeric_stats.max = target_value;
			}
		}
	}